

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&>::operator<
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&> *this,
          span<int,_18446744073709551615UL> *rhs)

{
  uint uVar1;
  lest *this_00;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  int *piVar6;
  uint *puVar7;
  span<int,_18446744073709551615UL> *in_R8;
  bool bVar8;
  string local_70;
  span<int,_18446744073709551615UL> local_50;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  piVar2 = rhs->data_;
  uVar3 = rhs->size_;
  uVar4 = *(ulong *)(this_00 + 8);
  if ((long)uVar3 < (long)*(ulong *)(this_00 + 8)) {
    uVar4 = uVar3;
  }
  piVar6 = piVar2;
  if ((uVar4 & 0x3fffffffffffffff) != 0) {
    puVar7 = *(uint **)this_00;
    puVar5 = puVar7 + uVar4;
    do {
      uVar1 = *puVar7;
      in_R8 = (span<int,_18446744073709551615UL> *)(ulong)uVar1;
      if ((int)uVar1 < *piVar6) {
        bVar8 = true;
        goto LAB_0018c788;
      }
      if (*piVar6 < (int)uVar1) {
        bVar8 = false;
        goto LAB_0018c788;
      }
      puVar7 = puVar7 + 1;
      piVar6 = piVar6 + 1;
    } while (puVar7 != puVar5);
  }
  bVar8 = piVar6 != piVar2 + uVar3;
LAB_0018c788:
  local_50.data_ = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
  to_string<nonstd::span_lite::span<int,18446744073709551615ul>,nonstd::span_lite::span<int,18446744073709551615ul>>
            (&local_70,this_00,&local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar8;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_50.data_ != local_40) {
    operator_delete(local_50.data_,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }